

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O0

void __thiscall
Bezier<3,_2>::set(Bezier<3,_2> *this,initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *list)

{
  const_iterator other;
  ColXpr local_70;
  const_iterator local_40;
  Matrix<double,_2,_1,_0,_2,_1> *it;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *__range2;
  initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *piStack_18;
  int i;
  initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *list_local;
  Bezier<3,_2> *this_local;
  
  __range2._4_4_ = 0;
  __begin0 = (const_iterator)list;
  piStack_18 = list;
  list_local = (initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)this;
  __end0 = std::initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::begin(list);
  it = std::initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::end
                 ((initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)__begin0);
  for (; other = __end0, __end0 != it; __end0 = __end0 + 1) {
    local_40 = __end0;
    Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
              (&local_70,
               (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)this->derivative_precal_points_,
               (long)__range2._4_4_);
    Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>::operator=
              ((Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true> *)&local_70,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)other);
    __range2._4_4_ = __range2._4_4_ + 1;
    if (3 < __range2._4_4_) break;
  }
  (**(this->super_Curve<3,_2>)._vptr_Curve)();
  return;
}

Assistant:

void set(const std::initializer_list<PointType>& list) {
    int i = 0;
    for (const auto& it : list) {
      derivative_precal_points_[0].col(i) = it;
      if (++i > N) {
        break;
      }
    }
    computeLength();
  }